

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithDepsLogTestDiscoveredDepDuringBuildChanged::Run
          (BuildWithDepsLogTestDiscoveredDepDuringBuildChanged *this)

{
  Test *pTVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  LoadStatus LVar6;
  Node *pNVar7;
  allocator<char> local_a39;
  string local_a38;
  undefined1 local_a18 [8];
  Builder builder_2;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  undefined1 local_8b0 [8];
  DepsLog deps_log_2;
  undefined1 local_840 [4];
  int fail_count_2;
  State state_2;
  string local_730;
  undefined1 local_710 [8];
  Builder builder_1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  undefined1 local_5a8 [8];
  DepsLog deps_log_1;
  undefined1 local_538 [4];
  int fail_count_1;
  State state_1;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  undefined1 local_3b8 [8];
  Builder builder;
  string local_298;
  undefined1 local_278 [8];
  DepsLog deps_log;
  undefined1 local_208 [4];
  int fail_count;
  State state;
  BuildLog build_log;
  string local_90;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *manifest;
  string err;
  BuildWithDepsLogTestDiscoveredDepDuringBuildChanged *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&manifest);
  local_38 = 
  "rule touch-out-implicit-dep\n  command = touch $out ; sleep 1 ; touch $test_dependency\nrule generate-depfile\n  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\nbuild out1: touch-out-implicit-dep in1\n  test_dependency = inimp\nbuild out2: generate-depfile in1 || out1\n  test_dependency = inimp\n  depfile = out2.d\n  deps = gcc\n"
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"in1",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"",(allocator<char> *)&build_log.field_0x67);
  VirtualFileSystem::Create
            (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&build_log.field_0x67);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  VirtualFileSystem::Tick(&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_);
  BuildLog::BuildLog((BuildLog *)
                     &state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  State::State((State *)local_208);
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pcVar2 = local_38;
  ManifestParserOptions::ManifestParserOptions
            ((ManifestParserOptions *)
             ((long)&deps_log.deps_.
                     super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  AssertParse((State *)local_208,pcVar2,stack0xfffffffffffffdec);
  iVar5 = testing::Test::AssertionFailures(g_current_test);
  if (iVar4 == iVar5) {
    DepsLog::DepsLog((DepsLog *)local_278);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"ninja_deps",
               (allocator<char> *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 7));
    bVar3 = DepsLog::OpenForWrite((DepsLog *)local_278,&local_298,(string *)&manifest);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xa8f,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 7));
    pTVar1 = g_current_test;
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&manifest);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xa90,"\"\" == err");
      if (bVar3) {
        Builder::Builder((Builder *)local_3b8,(State *)local_208,
                         &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,
                         (BuildLog *)
                         &state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(DepsLog *)local_278,
                         &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.super_DiskInterface
                         ,&(this->super_BuildWithDepsLogTest).super_BuildTest.status_.super_Status,0
                        );
        std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                  ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                   &builder.plan_.command_edges_,
                   &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                    super_CommandRunner);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"out2",&local_3d9);
        pNVar7 = Builder::AddTarget((Builder *)local_3b8,&local_3d8,(string *)&manifest);
        testing::Test::Check
                  (pTVar1,pNVar7 != (Node *)0x0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xa94,"builder.AddTarget(\"out2\", &err)");
        std::__cxx11::string::~string((string *)&local_3d8);
        std::allocator<char>::~allocator(&local_3d9);
        pTVar1 = g_current_test;
        bVar3 = Builder::AlreadyUpToDate((Builder *)local_3b8);
        testing::Test::Check
                  (pTVar1,(bool)(~bVar3 & 1),
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xa95,"builder.AlreadyUpToDate()");
        pTVar1 = g_current_test;
        bVar3 = Builder::Build((Builder *)local_3b8,(string *)&manifest);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xa97,"builder.Build(&err)");
        pTVar1 = g_current_test;
        bVar3 = Builder::AlreadyUpToDate((Builder *)local_3b8);
        testing::Test::Check
                  (pTVar1,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0xa98,"builder.AlreadyUpToDate()");
        DepsLog::Close((DepsLog *)local_278);
        std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                  ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                   &builder.plan_.command_edges_);
        Builder::~Builder((Builder *)local_3b8);
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    DepsLog::~DepsLog((DepsLog *)local_278);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  State::~State((State *)local_208);
  if ((int)deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    VirtualFileSystem::Tick(&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"in1",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"",
               (allocator<char> *)
               ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    VirtualFileSystem::Create
              (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_400,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    State::State((State *)local_538);
    iVar4 = testing::Test::AssertionFailures(g_current_test);
    pcVar2 = local_38;
    ManifestParserOptions::ManifestParserOptions
              ((ManifestParserOptions *)
               ((long)&deps_log_1.deps_.
                       super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 4));
    AssertParse((State *)local_538,pcVar2,stack0xfffffffffffffabc);
    iVar5 = testing::Test::AssertionFailures(g_current_test);
    if (iVar4 == iVar5) {
      DepsLog::DepsLog((DepsLog *)local_5a8);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,"ninja_deps",&local_5c9);
      LVar6 = DepsLog::Load((DepsLog *)local_5a8,&local_5c8,(State *)local_538,(string *)&manifest);
      bVar3 = testing::Test::Check
                        (pTVar1,LVar6 != LOAD_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xaa6,"deps_log.Load(\"ninja_deps\", &state, &err)");
      std::__cxx11::string::~string((string *)&local_5c8);
      std::allocator<char>::~allocator(&local_5c9);
      pTVar1 = g_current_test;
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5f0,"ninja_deps",
                   (allocator<char> *)((long)&builder_1.scan_.dyndep_loader_.disk_interface_ + 7));
        bVar3 = DepsLog::OpenForWrite((DepsLog *)local_5a8,&local_5f0,(string *)&manifest);
        bVar3 = testing::Test::Check
                          (pTVar1,bVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0xaa7,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
        std::__cxx11::string::~string((string *)&local_5f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&builder_1.scan_.dyndep_loader_.disk_interface_ + 7));
        pTVar1 = g_current_test;
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&manifest);
          bVar3 = testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0xaa8,"\"\" == err");
          if (bVar3) {
            Builder::Builder((Builder *)local_710,(State *)local_538,
                             &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,
                             (BuildLog *)
                             &state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(DepsLog *)local_5a8
                             ,&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.
                               super_DiskInterface,
                             &(this->super_BuildWithDepsLogTest).super_BuildTest.status_.
                              super_Status,0);
            std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                      ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                       &builder_1.plan_.command_edges_,
                       &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                        super_CommandRunner);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_730,"out2",
                       (allocator<char> *)
                       ((long)&state_2.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            pNVar7 = Builder::AddTarget((Builder *)local_710,&local_730,(string *)&manifest);
            testing::Test::Check
                      (pTVar1,pNVar7 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xaac,"builder.AddTarget(\"out2\", &err)");
            std::__cxx11::string::~string((string *)&local_730);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&state_2.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            pTVar1 = g_current_test;
            bVar3 = Builder::AlreadyUpToDate((Builder *)local_710);
            testing::Test::Check
                      (pTVar1,(bool)(~bVar3 & 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xaad,"builder.AlreadyUpToDate()");
            pTVar1 = g_current_test;
            bVar3 = Builder::Build((Builder *)local_710,(string *)&manifest);
            testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xaaf,"builder.Build(&err)");
            pTVar1 = g_current_test;
            bVar3 = Builder::AlreadyUpToDate((Builder *)local_710);
            testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xab0,"builder.AlreadyUpToDate()");
            DepsLog::Close((DepsLog *)local_5a8);
            std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                      ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                       &builder_1.plan_.command_edges_);
            Builder::~Builder((Builder *)local_710);
            deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      DepsLog::~DepsLog((DepsLog *)local_5a8);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    State::~State((State *)local_538);
    if ((int)deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
      VirtualFileSystem::Tick(&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_);
      State::State((State *)local_840);
      iVar4 = testing::Test::AssertionFailures(g_current_test);
      pcVar2 = local_38;
      ManifestParserOptions::ManifestParserOptions
                ((ManifestParserOptions *)
                 ((long)&deps_log_2.deps_.
                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      AssertParse((State *)local_840,pcVar2,stack0xfffffffffffff7b4);
      iVar5 = testing::Test::AssertionFailures(g_current_test);
      if (iVar4 == iVar5) {
        DepsLog::DepsLog((DepsLog *)local_8b0);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8d0,"ninja_deps",&local_8d1);
        LVar6 = DepsLog::Load((DepsLog *)local_8b0,&local_8d0,(State *)local_840,(string *)&manifest
                             );
        bVar3 = testing::Test::Check
                          (pTVar1,LVar6 != LOAD_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0xabd,"deps_log.Load(\"ninja_deps\", &state, &err)");
        std::__cxx11::string::~string((string *)&local_8d0);
        std::allocator<char>::~allocator(&local_8d1);
        pTVar1 = g_current_test;
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8f8,"ninja_deps",
                     (allocator<char> *)((long)&builder_2.scan_.dyndep_loader_.disk_interface_ + 7))
          ;
          bVar3 = DepsLog::OpenForWrite((DepsLog *)local_8b0,&local_8f8,(string *)&manifest);
          bVar3 = testing::Test::Check
                            (pTVar1,bVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0xabe,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
          std::__cxx11::string::~string((string *)&local_8f8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&builder_2.scan_.dyndep_loader_.disk_interface_ + 7))
          ;
          pTVar1 = g_current_test;
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&manifest);
            bVar3 = testing::Test::Check
                              (pTVar1,bVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0xabf,"\"\" == err");
            if (bVar3) {
              Builder::Builder((Builder *)local_a18,(State *)local_840,
                               &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,
                               (BuildLog *)
                               &state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (DepsLog *)local_8b0,
                               &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.
                                super_DiskInterface,
                               &(this->super_BuildWithDepsLogTest).super_BuildTest.status_.
                                super_Status,0);
              std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                        ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                         &builder_2.plan_.command_edges_,
                         &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                          super_CommandRunner);
              pTVar1 = g_current_test;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a38,"out2",&local_a39);
              pNVar7 = Builder::AddTarget((Builder *)local_a18,&local_a38,(string *)&manifest);
              testing::Test::Check
                        (pTVar1,pNVar7 != (Node *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xac3,"builder.AddTarget(\"out2\", &err)");
              std::__cxx11::string::~string((string *)&local_a38);
              std::allocator<char>::~allocator(&local_a39);
              pTVar1 = g_current_test;
              bVar3 = Builder::AlreadyUpToDate((Builder *)local_a18);
              testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xac4,"builder.AlreadyUpToDate()");
              DepsLog::Close((DepsLog *)local_8b0);
              std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                        ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                         &builder_2.plan_.command_edges_);
              Builder::~Builder((Builder *)local_a18);
              deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        DepsLog::~DepsLog((DepsLog *)local_8b0);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      State::~State((State *)local_840);
      if ((int)deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
        deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      }
    }
  }
  BuildLog::~BuildLog((BuildLog *)
                      &state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&manifest);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DiscoveredDepDuringBuildChanged) {
  string err;
  const char* manifest =
    "rule touch-out-implicit-dep\n"
    "  command = touch $out ; sleep 1 ; touch $test_dependency\n"
    "rule generate-depfile\n"
    "  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\n"
    "build out1: touch-out-implicit-dep in1\n"
    "  test_dependency = inimp\n"
    "build out2: generate-depfile in1 || out1\n"
    "  test_dependency = inimp\n"
    "  depfile = out2.d\n"
    "  deps = gcc\n";

  fs_.Create("in1", "");
  fs_.Tick();

  BuildLog build_log;

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_FALSE(builder.AlreadyUpToDate());

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }

  fs_.Tick();
  fs_.Create("in1", "");

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_FALSE(builder.AlreadyUpToDate());

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }

  fs_.Tick();

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }
}